

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O3

int FmsIOWrite(char *filename,char *protocol,FmsDataCollection dc)

{
  FmsFieldDescriptor fd;
  FmsField field;
  FmsDataCollection pFVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  bool bVar7;
  FmsBasisType basis_type;
  FmsComponent fc;
  char *fd_name;
  char *fdname;
  FmsIOContext ctx;
  FmsInt num_fields;
  FmsInt num_fds;
  FmsFieldType field_type;
  FmsFieldDescriptorType fd_type;
  char *fc_name;
  FmsScalarType dt;
  FmsMetaData md;
  FmsFieldDescriptor *fds;
  char *name;
  FmsField *fields;
  FmsMesh mesh;
  FmsInt fo [3];
  char tmp [20];
  FmsIOFunctions io;
  FmsLayoutType local_184;
  FmsComponent local_180;
  FmsFieldDescriptor local_178;
  char *local_170;
  FmsIOContext local_168;
  FmsInt local_148;
  FmsInt local_140;
  undefined8 local_138;
  FmsInt local_130;
  char *local_128;
  FmsScalarType local_11c;
  FmsDataCollection local_118;
  FmsMetaData local_110;
  FmsFieldDescriptor *local_108;
  char *local_100;
  FmsField *local_f8;
  FmsMesh local_f0;
  ulong local_e8;
  ulong local_e0;
  FmsInt local_d8 [2];
  char *local_c8 [3];
  FmsIOFunctions local_b0;
  
  if (filename == (char *)0x0) {
    return 1;
  }
  if (dc == (FmsDataCollection)0x0) {
    return 3;
  }
  local_168.temp_strings_size = 0;
  local_168.temp_strings_cap = 0x40;
  local_168.temp_strings = (char **)calloc(8,0x40);
  local_b0.open = FmsIOOpen;
  local_b0.close = FmsIOClose;
  local_b0.add_int = FmsIOAddInt;
  local_b0.add_int_array = FmsIOAddIntArray;
  local_b0.add_typed_int_array = FmsIOAddTypedIntArray;
  local_b0.add_float = FmsIOAddFloat;
  local_b0.add_double = FmsIOAddDouble;
  local_b0.add_scalar_array = FmsIOAddScalarArray;
  local_b0.add_string = FmsIOAddString;
  local_b0.has_path = FmsIOHasPath;
  local_b0.get_int = FmsIOGetInt;
  local_b0.get_typed_int_array = FmsIOGetTypedIntArray;
  local_b0.get_scalar_array = FmsIOGetScalarArray;
  local_b0.get_string = FmsIOGetString;
  local_168.fp = (FILE *)fopen(filename,"wt");
  if ((FILE *)local_168.fp == (FILE *)0x0) {
    return 5;
  }
  fprintf((FILE *)local_168.fp,"%s: %lu\n","FMS",100);
  local_108 = (FmsFieldDescriptor *)0x0;
  local_140 = 0;
  local_148 = 0;
  local_100 = (char *)0x0;
  iVar2 = FmsDataCollectionGetName(dc,&local_100);
  if (iVar2 == 0) {
    pcVar3 = join_keys("DataCollection","Name");
    if (pcVar3 == (char *)0x0) goto LAB_0010b078;
    fprintf((FILE *)local_168.fp,"%s: %s\n",pcVar3,local_100);
    free(pcVar3);
  }
  iVar2 = FmsDataCollectionGetFieldDescriptors(dc,&local_108,&local_140);
  if ((iVar2 == 0) &&
     (pcVar3 = join_keys("DataCollection","NumberOfFieldDescriptors"), pcVar3 != (char *)0x0)) {
    fprintf((FILE *)local_168.fp,"%s: %lu\n",pcVar3,local_140);
    free(pcVar3);
    pcVar3 = join_keys("DataCollection","FieldDescriptors");
    local_118 = dc;
    if (local_140 == 0) {
      bVar7 = true;
    }
    else {
      uVar6 = 0;
      do {
        bVar7 = false;
        sprintf((char *)local_c8,"%d",uVar6 & 0xffffffff);
        pcVar4 = join_keys(pcVar3,(char *)local_c8);
        fd = local_108[uVar6];
        local_178 = (FmsFieldDescriptor)0x0;
        iVar2 = FmsFieldDescriptorGetName(fd,(char **)&local_178);
        if (iVar2 == 0) {
          pcVar5 = join_keys(pcVar4,"Name");
          if (pcVar5 != (char *)0x0) {
            fprintf((FILE *)local_168.fp,"%s: %s\n",pcVar5,local_178);
            free(pcVar5);
          }
          local_180 = (FmsComponent)0x0;
          iVar2 = FmsFieldDescriptorGetComponent(fd,&local_180);
          if ((iVar2 == 0) && (local_180 != (FmsComponent)0x0)) {
            local_128 = (char *)0x0;
            iVar2 = FmsComponentGetName(local_180,&local_128);
            if (iVar2 == 0) {
              pcVar5 = join_keys(pcVar4,"ComponentName");
              if (pcVar5 != (char *)0x0) {
                fprintf((FILE *)local_168.fp,"%s: %s\n",pcVar5,local_128);
                free(pcVar5);
              }
              iVar2 = FmsFieldDescriptorGetType(fd,(FmsFieldDescriptorType *)&local_130);
              if (iVar2 == 0) {
                pcVar5 = join_keys(pcVar4,"Type");
                if (pcVar5 != (char *)0x0) {
                  fprintf((FILE *)local_168.fp,"%s: %lu\n",pcVar5,
                          (long)(int)(FmsFieldDescriptorType)local_130);
                  free(pcVar5);
                }
                iVar2 = FmsFieldDescriptorGetFixedOrder
                                  (fd,(FmsFieldType *)&local_138,&local_184,local_d8);
                if (iVar2 == 0) {
                  local_e8 = (ulong)(FmsFieldType)local_138;
                  local_e0 = (ulong)local_184;
                  pcVar5 = join_keys(pcVar4,"FixedOrder");
                  FmsIOAddIntArray(&local_168,pcVar5,&local_e8,3);
                  if (pcVar5 != (char *)0x0) {
                    free(pcVar5);
                  }
                  local_170 = (char *)0x0;
                  iVar2 = FmsFieldDescriptorGetNumDofs(fd,(FmsInt *)&local_170);
                  bVar7 = iVar2 == 0;
                  if ((bVar7) && (pcVar5 = join_keys(pcVar4,"NumDofs"), pcVar5 != (char *)0x0)) {
                    fprintf((FILE *)local_168.fp,"%s: %lu\n",pcVar5,local_170);
                    free(pcVar5);
                  }
                  goto LAB_0010b1bd;
                }
              }
            }
          }
          bVar7 = false;
        }
LAB_0010b1bd:
        if (pcVar4 != (char *)0x0) {
          free(pcVar4);
        }
        uVar6 = uVar6 + 1;
      } while ((bool)(bVar7 & uVar6 < local_140));
    }
    pFVar1 = local_118;
    if (pcVar3 != (char *)0x0) {
      free(pcVar3);
    }
    if (((bVar7) && (iVar2 = FmsDataCollectionGetFields(pFVar1,&local_f8,&local_148), iVar2 == 0))
       && (pcVar3 = join_keys("DataCollection","NumberOfFields"), pcVar3 != (char *)0x0)) {
      fprintf((FILE *)local_168.fp,"%s: %lu\n",pcVar3,local_148);
      free(pcVar3);
      pcVar3 = join_keys("DataCollection","Fields");
      if (local_148 == 0) {
        bVar7 = true;
      }
      else {
        uVar6 = 0;
        do {
          bVar7 = false;
          sprintf((char *)&local_e8,"%d",uVar6 & 0xffffffff);
          pcVar4 = join_keys(pcVar3,(char *)&local_e8);
          field = local_f8[uVar6];
          iVar2 = FmsFieldGetName(field,local_c8);
          if (iVar2 == 0) {
            pcVar5 = join_keys(pcVar4,"Name");
            if (pcVar5 != (char *)0x0) {
              fprintf((FILE *)local_168.fp,"%s: %s\n",pcVar5,local_c8[0]);
              free(pcVar5);
            }
            bVar7 = false;
            local_178 = (FmsFieldDescriptor)0x0;
            local_180 = (FmsComponent)0x0;
            iVar2 = FmsFieldGet(field,&local_178,(FmsInt *)&local_180,&local_184,&local_11c,
                                &local_128);
            if (iVar2 == 0) {
              pcVar5 = join_keys(pcVar4,"LayoutType");
              if (pcVar5 != (char *)0x0) {
                fprintf((FILE *)local_168.fp,"%s: %lu\n",pcVar5,(ulong)local_184);
                free(pcVar5);
              }
              pcVar5 = join_keys(pcVar4,"NumberOfVectorComponents");
              if (pcVar5 != (char *)0x0) {
                fprintf((FILE *)local_168.fp,"%s: %lu\n",pcVar5,local_180);
                free(pcVar5);
              }
              if (local_178 != (FmsFieldDescriptor)0x0) {
                local_170 = (char *)0x0;
                iVar2 = FmsFieldDescriptorGetName(local_178,&local_170);
                if (iVar2 == 0) {
                  pcVar5 = join_keys(pcVar4,"FieldDescriptorName");
                  if (pcVar5 != (char *)0x0) {
                    fprintf((FILE *)local_168.fp,"%s: %s\n",pcVar5,local_170);
                    free(pcVar5);
                  }
                  local_130 = 0;
                  FmsFieldDescriptorGetNumDofs(local_178,&local_130);
                  pcVar5 = join_keys(pcVar4,"Data");
                  FmsIOAddScalarArray(&local_168,pcVar5,local_11c,local_128,
                                      local_130 * (long)local_180);
                  if (pcVar5 != (char *)0x0) {
                    free(pcVar5);
                  }
                  iVar2 = FmsFieldGetMetaData(field,(FmsMetaData *)&local_138);
                  bVar7 = iVar2 == 0;
                  if ((bVar7) && (CONCAT44(local_138._4_4_,(FmsFieldType)local_138) != 0)) {
                    pcVar5 = join_keys(pcVar4,"MetaData");
                    FmsIOWriteFmsMetaData
                              (&local_168,&local_b0,pcVar5,
                               (FmsMetaData)CONCAT44(local_138._4_4_,(FmsFieldType)local_138));
                    if (pcVar5 != (char *)0x0) {
                      free(pcVar5);
                    }
                  }
                  goto LAB_0010b55c;
                }
              }
              bVar7 = false;
            }
          }
LAB_0010b55c:
          if (pcVar4 != (char *)0x0) {
            free(pcVar4);
          }
          uVar6 = uVar6 + 1;
        } while ((bool)(bVar7 & uVar6 < local_148));
      }
      if (pcVar3 != (char *)0x0) {
        free(pcVar3);
      }
      pFVar1 = local_118;
      if ((bVar7) && (iVar2 = FmsDataCollectionGetMesh(local_118,&local_f0), iVar2 == 0)) {
        pcVar3 = join_keys("DataCollection","Mesh");
        iVar2 = FmsIOWriteFmsMesh(&local_168,&local_b0,pcVar3,local_f0);
        if (pcVar3 != (char *)0x0) {
          free(pcVar3);
        }
        if ((iVar2 == 0) && (iVar2 = FmsDataCollectionGetMetaData(pFVar1,&local_110), iVar2 == 0)) {
          if (local_110 != (FmsMetaData)0x0) {
            pcVar3 = join_keys("DataCollection","MetaData");
            iVar2 = FmsIOWriteFmsMetaData(&local_168,&local_b0,pcVar3,local_110);
            if (pcVar3 != (char *)0x0) {
              free(pcVar3);
            }
            if (iVar2 != 0) goto LAB_0010b078;
          }
          iVar2 = FmsIOClose(&local_168);
          return (uint)(iVar2 != 0) << 3;
        }
      }
    }
  }
LAB_0010b078:
  FmsIOClose(&local_168);
  return 7;
}

Assistant:

int
FmsIOWrite(const char *filename, const char *protocol, FmsDataCollection dc) {
  FmsIOContext ctx;
  FmsIOFunctions io;

  if(filename == NULL) E_RETURN(1);
  if(protocol == NULL) protocol = "ascii";
  if(!dc) E_RETURN(3);

#ifdef FMS_HAVE_CONDUIT
  int isSupported = CheckProtocolSupportConduit(protocol);
  if(isSupported == 1) {
    FmsIOContextInitializeConduit(&ctx, protocol);
    FmsIOFunctionsInitializeConduit(&io);
  } else if(isSupported == 2) {
    FmsIOContextInitialize(&ctx);
    FmsIOFunctionsInitialize(&io);
  } else if(isSupported == 0) {
    // fprintf(stderr, "The protocol %s is not supported by this Conduit runtime.", protocol);
    return 2;
  } else {
    E_RETURN(4);
  }
#else
  FmsIOContextInitialize(&ctx);
  FmsIOFunctionsInitialize(&io);
#endif

  /* "open" the file. */
  if((*io.open)(&ctx, filename, "wt") == 0) {
    // FMS format version of this writer: 100 = v0.1
    const FmsInt fms_format_version = 100;
    if((*io.add_int)(&ctx, "FMS", fms_format_version) != 0) {
      /* "close" the file. */
      (*io.close)(&ctx);
      E_RETURN(6);
    }

    if(FmsIOWriteFmsDataCollection(&ctx, &io, "DataCollection", dc) != 0) {
      /* "close" the file. */
      (*io.close)(&ctx);
      E_RETURN(7);
    }

    if((*io.close)(&ctx) != 0)
      E_RETURN(8);
  } else {
    E_RETURN(5);
  }

  return 0;
}